

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lts.c
# Opt level: O3

char * cst_substr(char *str,int start,int length)

{
  char *__dest;
  
  if (str == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)__ckd_malloc__((long)(length + 1),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                    ,0x59);
    strncpy(__dest,str + start,(long)length);
    __dest[length] = '\0';
  }
  return __dest;
}

Assistant:

static char *
cst_substr(const char *str, int start, int length)
{
    char *nstr = NULL;

    if (str) {
        nstr = ckd_malloc(length + 1);
        strncpy(nstr, str + start, length);
        nstr[length] = '\0';
    }
    return nstr;
}